

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# writeDeepTiledFile.cpp
# Opt level: O1

void writeDeepTiledFile(char *filename,Box2i *displayWindow,Box2i *dataWindow,int tileSizeX,
                       int tileSizeY)

{
  void *pvVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  char *pcVar6;
  undefined4 *puVar7;
  void *pvVar8;
  void *pvVar9;
  void *pvVar10;
  uint uVar11;
  ulong uVar12;
  int j;
  ulong uVar13;
  void *pvVar14;
  int iVar15;
  int iVar16;
  uint uVar17;
  ulong uVar18;
  void *pvVar19;
  int i;
  long lVar20;
  DeepTiledOutputFile file;
  Header header;
  DeepFrameBuffer frameBuffer;
  Slice local_68 [56];
  
  iVar16 = (dataWindow->max).y;
  iVar3 = (dataWindow->min).y;
  iVar2 = (dataWindow->max).x - (dataWindow->min).x;
  frameBuffer._map._M_t._M_impl._0_8_ = 0;
  Imf_3_4::Header::Header((Header *)0x3f800000,0x3f800000,&header);
  pcVar6 = (char *)Imf_3_4::Header::channels();
  Imf_3_4::Channel::Channel((Channel *)&frameBuffer,FLOAT,1,1,false);
  Imf_3_4::ChannelList::insert(pcVar6,(Channel *)0x10a0fb);
  pcVar6 = (char *)Imf_3_4::Header::channels();
  Imf_3_4::Channel::Channel((Channel *)&frameBuffer,HALF,1,1,false);
  Imf_3_4::ChannelList::insert(pcVar6,(Channel *)0x10a101);
  Imf_3_4::Header::setType((string *)&header);
  puVar7 = (undefined4 *)Imf_3_4::Header::compression();
  *puVar7 = 2;
  frameBuffer._map._M_t._M_impl._4_4_ = tileSizeY;
  frameBuffer._map._M_t._M_impl._0_4_ = tileSizeX;
  frameBuffer._map._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  frameBuffer._map._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  Imf_3_4::Header::setTileDescription((TileDescription *)&header);
  iVar16 = iVar16 - iVar3;
  uVar11 = iVar16 + 1;
  uVar17 = iVar2 + 1;
  lVar20 = (long)(int)uVar17;
  uVar13 = (int)uVar11 * lVar20;
  uVar18 = -(ulong)(uVar13 >> 0x3d != 0) | uVar13 * 8;
  pvVar8 = operator_new__(uVar18);
  pvVar9 = operator_new__(uVar18);
  pvVar10 = operator_new__(-(ulong)(uVar13 >> 0x3e != 0) | uVar13 * 4);
  iVar3 = Imf_3_4::globalThreadCount();
  Imf_3_4::DeepTiledOutputFile::DeepTiledOutputFile(&file,filename,&header,iVar3);
  frameBuffer._map._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &frameBuffer._map._M_t._M_impl.super__Rb_tree_header._M_header;
  frameBuffer._map._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
       frameBuffer._map._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ & 0xffffffff00000000;
  frameBuffer._map._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  frameBuffer._map._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  frameBuffer._map._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       frameBuffer._map._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  Imf_3_4::Slice::Slice(&frameBuffer._sampleCounts,HALF,(char *)0x0,0,0,1,1,0.0,false,false);
  Imf_3_4::Slice::Slice
            (local_68,UINT,
             (char *)((long)pvVar10 +
                     (dataWindow->min).y * lVar20 * -4 + (long)(dataWindow->min).x * -4),4,
             lVar20 * 4,1,1,0.0,false,false);
  Imf_3_4::DeepFrameBuffer::insertSampleCountSlice((Slice *)&frameBuffer);
  uVar13 = lVar20 * 8;
  Imf_3_4::DeepSlice::DeepSlice
            ((DeepSlice *)local_68,FLOAT,
             (char *)((long)pvVar8 +
                     (dataWindow->min).y * lVar20 * -8 + (long)(dataWindow->min).x * -8),8,uVar13,4,
             1,1,0.0,false,false);
  Imf_3_4::DeepFrameBuffer::insert((char *)&frameBuffer,(DeepSlice *)0x10a0fb);
  Imf_3_4::DeepSlice::DeepSlice
            ((DeepSlice *)local_68,HALF,
             (char *)((long)pvVar9 +
                     (dataWindow->min).y * lVar20 * -8 + (long)(dataWindow->min).x * -8),8,uVar13,2,
             1,1,0.0,false,false);
  Imf_3_4::DeepFrameBuffer::insert((char *)&frameBuffer,(DeepSlice *)0x10a101);
  Imf_3_4::DeepTiledOutputFile::setFrameBuffer((DeepFrameBuffer *)&file);
  iVar3 = 0;
  while( true ) {
    iVar15 = (int)&file;
    iVar4 = Imf_3_4::DeepTiledOutputFile::numYTiles(iVar15);
    if (iVar4 <= iVar3) break;
    iVar4 = 0;
    while( true ) {
      iVar5 = Imf_3_4::DeepTiledOutputFile::numXTiles(iVar15);
      if (iVar5 <= iVar4) break;
      Imf_3_4::DeepTiledOutputFile::writeTile(iVar15,iVar4,iVar3);
      iVar4 = iVar4 + 1;
    }
    iVar3 = iVar3 + 1;
  }
  if (-1 < iVar16) {
    uVar18 = 0;
    pvVar14 = pvVar8;
    pvVar19 = pvVar9;
    do {
      if (-1 < iVar2) {
        uVar12 = 0;
        do {
          pvVar1 = *(void **)((long)pvVar14 + uVar12 * 8);
          if (pvVar1 != (void *)0x0) {
            operator_delete__(pvVar1);
          }
          pvVar1 = *(void **)((long)pvVar19 + uVar12 * 8);
          if (pvVar1 != (void *)0x0) {
            operator_delete__(pvVar1);
          }
          uVar12 = uVar12 + 1;
        } while (uVar17 != uVar12);
      }
      uVar18 = uVar18 + 1;
      pvVar19 = (void *)((long)pvVar19 + uVar13);
      pvVar14 = (void *)((long)pvVar14 + uVar13);
    } while (uVar18 != uVar11);
  }
  std::
  _Rb_tree<Imf_3_4::Name,_std::pair<const_Imf_3_4::Name,_Imf_3_4::DeepSlice>,_std::_Select1st<std::pair<const_Imf_3_4::Name,_Imf_3_4::DeepSlice>_>,_std::less<Imf_3_4::Name>,_std::allocator<std::pair<const_Imf_3_4::Name,_Imf_3_4::DeepSlice>_>_>
  ::~_Rb_tree((_Rb_tree<Imf_3_4::Name,_std::pair<const_Imf_3_4::Name,_Imf_3_4::DeepSlice>,_std::_Select1st<std::pair<const_Imf_3_4::Name,_Imf_3_4::DeepSlice>_>,_std::less<Imf_3_4::Name>,_std::allocator<std::pair<const_Imf_3_4::Name,_Imf_3_4::DeepSlice>_>_>
               *)&frameBuffer);
  Imf_3_4::DeepTiledOutputFile::~DeepTiledOutputFile(&file);
  operator_delete__(pvVar10);
  operator_delete__(pvVar9);
  operator_delete__(pvVar8);
  Imf_3_4::Header::~Header(&header);
  return;
}

Assistant:

void
writeDeepTiledFile (
    const char filename[],
    Box2i      displayWindow,
    Box2i      dataWindow,
    int        tileSizeX,
    int        tileSizeY)
{
    int height = dataWindow.max.y - dataWindow.min.y + 1;
    int width  = dataWindow.max.x - dataWindow.min.x + 1;

    Header header (displayWindow, dataWindow);
    header.channels ().insert ("Z", Channel (FLOAT));
    header.channels ().insert ("A", Channel (HALF));
    header.setType (DEEPTILE);
    header.compression () = ZIPS_COMPRESSION;

    header.setTileDescription (
        TileDescription (tileSizeX, tileSizeY, ONE_LEVEL));

    Array2D<float*> dataZ;
    dataZ.resizeErase (height, width);

    Array2D<half*> dataA;
    dataA.resizeErase (height, width);

    Array2D<unsigned int> sampleCount;
    sampleCount.resizeErase (height, width);

    DeepTiledOutputFile file (filename, header);

    DeepFrameBuffer frameBuffer;

    frameBuffer.insertSampleCountSlice (Slice (
        UINT,
        (char*) (&sampleCount[0][0] - dataWindow.min.x - dataWindow.min.y * width),
        sizeof (unsigned int) * 1,       // xStride
        sizeof (unsigned int) * width)); // yStride

    frameBuffer.insert (
        "Z",
        DeepSlice (
            FLOAT,
            (char*) (&dataZ[0][0] - dataWindow.min.x - dataWindow.min.y * width),
            sizeof (float*) * 1,     // xStride for pointer array
            sizeof (float*) * width, // yStride for pointer array
            sizeof (float) * 1));    // stride for samples

    frameBuffer.insert (
        "A",
        DeepSlice (
            HALF,
            (char*) (&dataA[0][0] - dataWindow.min.x - dataWindow.min.y * width),
            sizeof (half*) * 1,     // xStride for pointer array
            sizeof (half*) * width, // yStride for pointer array
            sizeof (half) * 1));    // stride for samples

    file.setFrameBuffer (frameBuffer);

    for (int j = 0; j < file.numYTiles (0); j++)
    {
        for (int i = 0; i < file.numXTiles (0); i++)
        {
            // Generate data for sampleCount, dataZ and dataA.
            getSampleDataForTile (i, j, tileSizeX, tileSizeY, sampleCount, dataZ, dataA);
            file.writeTile (i, j, 0);
        }
    }
    
    for (int i = 0; i < height; i++)
    {
        for (int j = 0; j < width; j++)
        {
            delete[] dataZ[i][j];
            delete[] dataA[i][j];
        }
    }
}